

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O3

void corrupted_header_correct_superblock_test(void)

{
  fdb_kvs_handle **ppfVar1;
  fdb_kvs_handle *doc_00;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  anomalous_callbacks *paVar5;
  filemgr_ops *pfVar6;
  size_t __size;
  void *__ptr;
  int *piVar7;
  undefined4 extraout_EDX;
  ulong uVar8;
  char *pcVar9;
  fdb_kvs_handle *pfVar10;
  uint uVar11;
  fdb_file_handle *dbfile;
  fdb_doc *doc;
  fdb_kvs_handle *db;
  timeval __test_begin;
  char valuebuf [256];
  char keybuf [256];
  fdb_kvs_handle *local_388;
  fdb_kvs_handle *local_380;
  fdb_kvs_handle *local_378;
  filemgr_ops *local_370;
  anomalous_callbacks *local_368;
  fdb_kvs_config local_360;
  timeval local_348;
  fdb_kvs_handle local_338;
  
  gettimeofday(&local_348,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  anomaly_test* > errorlog.txt");
  fdb_get_default_config();
  local_338.config.encryption_key.bytes[0xc] = '\0';
  local_338.config.encryption_key.bytes[0xd] = '\0';
  local_338.config.encryption_key.bytes[0xe] = '\0';
  local_338.config.encryption_key.bytes[0xf] = '\0';
  local_338.config.encryption_key.bytes[0x10] = '\0';
  local_338.config.encryption_key.bytes[0x11] = '\0';
  local_338.config.encryption_key.bytes[0x12] = '\0';
  local_338.config.encryption_key.bytes[0x13] = '\0';
  fdb_get_default_kvs_config();
  paVar5 = get_default_anon_cbs();
  filemgr_ops_anomalous_init(paVar5,(void *)0x0);
  pfVar6 = get_normal_ops_ptr();
  pcVar9 = "anomaly_test1";
  pfVar10 = (fdb_kvs_handle *)&local_388;
  fVar2 = fdb_open((fdb_file_handle **)pfVar10,"anomaly_test1",
                   (fdb_config *)(local_338.config.encryption_key.bytes + 4));
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00108860;
  pcVar9 = (char *)&local_378;
  pfVar10 = local_388;
  local_370 = pfVar6;
  local_368 = paVar5;
  fVar2 = fdb_kvs_open((fdb_file_handle *)local_388,(fdb_kvs_handle **)pcVar9,(char *)0x0,&local_360
                      );
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00108865;
  ppfVar1 = &local_338.bub_ctx.handle;
  uVar8 = 0;
  do {
    pfVar10 = (fdb_kvs_handle *)0x0;
    do {
      sprintf((char *)ppfVar1,"k%06d",pfVar10);
      sprintf((char *)&local_338,"v%d_%04d",uVar8);
      fdb_doc_create((fdb_doc **)&local_380,ppfVar1,8,(void *)0x0,0,&local_338,8);
      fVar2 = fdb_set(local_378,(fdb_doc *)local_380);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        corrupted_header_correct_superblock_test();
        goto LAB_00108849;
      }
      fdb_doc_free((fdb_doc *)local_380);
      uVar11 = (int)pfVar10 + 1;
      pfVar10 = (fdb_kvs_handle *)(ulong)uVar11;
    } while (uVar11 != 200);
    pcVar9 = (char *)0x0;
    fVar2 = fdb_commit((fdb_file_handle *)local_388,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_00108849:
      corrupted_header_correct_superblock_test();
      goto LAB_0010884e;
    }
    uVar11 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar11;
  } while (uVar11 != 4);
  pfVar10 = local_388;
  fVar2 = fdb_close((fdb_file_handle *)local_388);
  paVar5 = local_368;
  pfVar6 = local_370;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010886a;
  iVar3 = (*local_368->open_cb)((void *)0x0,local_370,"anomaly_test1",2,0x1a4);
  iVar4 = (*paVar5->open_cb)((void *)0x0,pfVar6,"anomaly_test2",0x42,0x1a4);
  __size = (*paVar5->file_size_cb)((void *)0x0,pfVar6,"anomaly_test1");
  __ptr = malloc(__size);
  (*paVar5->pread_cb)((void *)0x0,pfVar6,iVar3,__ptr,__size,0);
  (*paVar5->pwrite_cb)((void *)0x0,pfVar6,iVar4,__ptr,__size - 0x1000,0);
  (*paVar5->close_cb)((void *)0x0,pfVar6,iVar3);
  (*paVar5->close_cb)((void *)0x0,pfVar6,iVar4);
  free(__ptr);
  pfVar10 = (fdb_kvs_handle *)&local_388;
  pcVar9 = "anomaly_test2";
  fVar2 = fdb_open((fdb_file_handle **)pfVar10,"anomaly_test2",
                   (fdb_config *)(local_338.config.encryption_key.bytes + 4));
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010886f;
  pcVar9 = (char *)&local_378;
  pfVar10 = local_388;
  fVar2 = fdb_kvs_open((fdb_file_handle *)local_388,(fdb_kvs_handle **)pcVar9,(char *)0x0,&local_360
                      );
  if (fVar2 == FDB_RESULT_SUCCESS) {
    ppfVar1 = &local_338.bub_ctx.handle;
    uVar11 = 0;
    do {
      sprintf((char *)ppfVar1,"k%06d",(ulong)uVar11);
      sprintf((char *)&local_338,"v%d_%04d",2);
      fdb_doc_create((fdb_doc **)&local_380,ppfVar1,8,(void *)0x0,0,(void *)0x0,0);
      pcVar9 = (char *)local_380;
      pfVar10 = local_378;
      fVar2 = fdb_get(local_378,(fdb_doc *)local_380);
      doc_00 = local_380;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010885b;
      pfVar10 = (fdb_kvs_handle *)(local_380->field_6).seqtree;
      pcVar9 = (char *)&local_338;
      iVar3 = bcmp(pfVar10,&local_338,(size_t)(local_380->kvs_config).custom_cmp_param);
      if (iVar3 != 0) goto LAB_0010884e;
      fdb_doc_free((fdb_doc *)doc_00);
      uVar11 = uVar11 + 1;
    } while (uVar11 != 200);
    fVar2 = fdb_close((fdb_file_handle *)local_388);
    pfVar10 = local_388;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_shutdown();
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (corrupted_header_correct_superblock_test()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar9,"corrupted DB header from correct superblock test");
      return;
    }
    goto LAB_00108879;
  }
  goto LAB_00108874;
LAB_0010884e:
  pcVar9 = (char *)pfVar10;
  pfVar10 = &local_338;
  corrupted_header_correct_superblock_test();
LAB_0010885b:
  corrupted_header_correct_superblock_test();
LAB_00108860:
  corrupted_header_correct_superblock_test();
LAB_00108865:
  corrupted_header_correct_superblock_test();
LAB_0010886a:
  corrupted_header_correct_superblock_test();
LAB_0010886f:
  corrupted_header_correct_superblock_test();
LAB_00108874:
  corrupted_header_correct_superblock_test();
LAB_00108879:
  corrupted_header_correct_superblock_test();
  iVar3 = *(int *)&(pfVar10->kvs_config).field_0x4;
  *(int *)&(pfVar10->kvs_config).field_0x4 = iVar3 + 1;
  if (iVar3 < *(int *)&(pfVar10->kvs_config).custom_cmp) {
    (*(code *)((fdb_kvs_handle *)pcVar9)->staletree)(extraout_EDX);
    return;
  }
  *(int *)&pfVar10->kvs_config = *(int *)&pfVar10->kvs_config + 1;
  piVar7 = __errno_location();
  *piVar7 = -2;
  return;
}

Assistant:

void corrupted_header_correct_superblock_test()
{
    TEST_INIT();
    int n=200, n_commits=4, i, j, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[256];
    struct filemgr_ops *normal_ops;

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    kvs_config = fdb_get_default_kvs_config();

    struct anomalous_callbacks *cbs = get_default_anon_cbs();
    filemgr_ops_anomalous_init(cbs, NULL);

    normal_ops = get_normal_ops_ptr();

    // create a file
    s = fdb_open(&dbfile, "anomaly_test1", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    for (j=0; j<n_commits; ++j) {
        for (i=0; i<n; ++i) {
            sprintf(keybuf, "k%06d", i);
            sprintf(valuebuf, "v%d_%04d", j, i);
            fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 8);
            s = fdb_set(db, doc);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            fdb_doc_free(doc);
        }
        s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // copy the data in the file except for the last (header) block
    int fd = cbs->open_cb(NULL, normal_ops, "anomaly_test1", O_RDWR, 0644);
    int fd_dst = cbs->open_cb(NULL, normal_ops,
                              "anomaly_test2", O_CREAT | O_RDWR, 0644);
    uint64_t offset = cbs->file_size_cb(NULL, normal_ops, "anomaly_test1");
    uint8_t *filedata = (uint8_t*)malloc(offset);
    cbs->pread_cb(NULL, normal_ops, fd, (void*)filedata, offset, 0);
    cbs->pwrite_cb(NULL, normal_ops, fd_dst, (void*)filedata, offset - 4096, 0);
    cbs->close_cb(NULL, normal_ops, fd);
    cbs->close_cb(NULL, normal_ops, fd_dst);
    free(filedata);

    // open the corrupted file
    s = fdb_open(&dbfile, "anomaly_test2", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // data at the 3rd commit should be read
    j = 2;
    for (i=0; i<n; ++i) {
        sprintf(keybuf, "k%06d", i);
        sprintf(valuebuf, "v%d_%04d", j, i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(doc->body, valuebuf, doc->bodylen);
        fdb_doc_free(doc);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_shutdown();
    memleak_end();

    TEST_RESULT("corrupted DB header from correct superblock test");
}